

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

void handle_level_stairs(chunk *c,_Bool persistent,wchar_t down_count,wchar_t up_count)

{
  int iVar1;
  wchar_t wVar2;
  chunk_conflict *pcVar3;
  wchar_t minsep;
  undefined7 in_register_00000031;
  
  wVar2 = c->height;
  if (c->width < c->height) {
    wVar2 = c->width;
  }
  wVar2 = wVar2 / 4;
  iVar1 = (int)CONCAT71(in_register_00000031,persistent);
  minsep = iVar1 * 4;
  if (wVar2 != minsep && SBORROW4(wVar2,minsep) == wVar2 + iVar1 * -4 < 0) {
    minsep = wVar2;
  }
  if (iVar1 == 0) {
    alloc_stairs((chunk_conflict *)c,FEAT_MORE,down_count,minsep,false,dun->one_off_below);
  }
  else {
    pcVar3 = chunk_find_adjacent(c->depth,"down");
    if (pcVar3 == (chunk_conflict *)0x0) {
      alloc_stairs((chunk_conflict *)c,FEAT_MORE,down_count,minsep,false,dun->one_off_below);
    }
    pcVar3 = chunk_find_adjacent(c->depth,"up");
    if (pcVar3 != (chunk_conflict *)0x0) {
      return;
    }
  }
  alloc_stairs((chunk_conflict *)c,FEAT_LESS,up_count,minsep,false,dun->one_off_above);
  return;
}

Assistant:

static void handle_level_stairs(struct chunk *c, bool persistent,
		int down_count, int up_count)
{
	/*
	 * For persistent levels, require that the stairs be at least four
	 * grids apart (two for surrounding walls; two for a buffer between
	 * the walls; the buffer space could be one - shared by the
	 * staircases - but the reservations in the room map don't allow for
	 * that) so the staircase rooms in the connecting level won't overlap.
	 * For both the persistent and non-persistent case, also require that
	 * the stairs be at least 1/4th of the level's diameter (PowerDiver's
	 * suggestion) apart to prevent them from all appearing in certain
	 * rooms.
	 */
	int minsep = MAX(MIN(c->width, c->height) / 4, (persistent) ? 4 : 0);

	if (!persistent || !chunk_find_adjacent(c->depth, "down")) {
		alloc_stairs(c, FEAT_MORE, down_count, minsep, false,
			dun->one_off_below);
	}
	if (!persistent || !chunk_find_adjacent(c->depth, "up")) {
		alloc_stairs(c, FEAT_LESS, up_count, minsep, false,
			dun->one_off_above);
	}
}